

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testparser.c
# Opt level: O0

int testNodeGetContent(void)

{
  undefined8 uVar1;
  int iVar2;
  long lVar3;
  undefined8 uVar4;
  char *__s1;
  uint local_1c;
  int err;
  xmlChar *content;
  xmlDocPtr doc;
  
  lVar3 = xmlReadDoc("<doc/>",0,0,0);
  uVar1 = *(undefined8 *)(lVar3 + 0x18);
  uVar4 = xmlNewReference(lVar3,"lt");
  xmlAddChild(uVar1,uVar4);
  __s1 = (char *)xmlNodeGetContent(lVar3);
  iVar2 = strcmp(__s1,"<");
  if (iVar2 != 0) {
    fprintf(_stderr,"xmlNodeGetContent failed\n");
  }
  local_1c = (uint)(iVar2 != 0);
  (*_xmlFree)(__s1);
  xmlFreeDoc(lVar3);
  return local_1c;
}

Assistant:

static int
testNodeGetContent(void) {
    xmlDocPtr doc;
    xmlChar *content;
    int err = 0;

    doc = xmlReadDoc(BAD_CAST "<doc/>", NULL, NULL, 0);
    xmlAddChild(doc->children, xmlNewReference(doc, BAD_CAST "lt"));
    content = xmlNodeGetContent((xmlNodePtr) doc);
    if (strcmp((char *) content, "<") != 0) {
        fprintf(stderr, "xmlNodeGetContent failed\n");
        err = 1;
    }
    xmlFree(content);
    xmlFreeDoc(doc);

    return err;
}